

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

int ra_shrink_to_fit(roaring_array_t *ra)

{
  int new_capacity;
  int iVar1;
  _Bool _Var2;
  int iVar3;
  
  new_capacity = ra->size;
  iVar1 = ra->allocation_size;
  _Var2 = realloc_array(ra,new_capacity);
  iVar3 = 0;
  if (_Var2) {
    iVar3 = (iVar1 - new_capacity) * 0xb;
    ra->allocation_size = ra->size;
  }
  return iVar3;
}

Assistant:

int ra_shrink_to_fit(roaring_array_t *ra) {
    int savings = (ra->allocation_size - ra->size) *
                  (sizeof(uint16_t) + sizeof(container_t *) + sizeof(uint8_t));
    if (!realloc_array(ra, ra->size)) {
      return 0;
    }
    ra->allocation_size = ra->size;
    return savings;
}